

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RepeatLoopInst::Exec
          (RepeatLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  int minGroupId;
  int maxGroupId;
  CharCount CVar2;
  bool bVar3;
  uint uVar4;
  BeginLoopInst *pBVar5;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  uint8 *puVar6;
  char *pcVar7;
  Label LVar8;
  
  pBVar5 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopInst>
                     (matcher,BeginLoop,(this->super_RepeatLoopMixin).beginLabel);
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId
                           );
  if ((pBVar5->super_BeginLoopMixin).hasInnerNondet == true) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo
               ,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar4 = origLoopInfo->number + 1;
  origLoopInfo->number = uVar4;
  uVar1 = (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower;
  if (uVar4 < uVar1) {
    origLoopInfo->startInputOffset = *inputOffset;
    minGroupId = (pBVar5->super_BodyGroupsMixin).minBodyGroupId;
    maxGroupId = (pBVar5->super_BodyGroupsMixin).maxBodyGroupId;
    if ((pBVar5->super_BeginLoopMixin).hasInnerNondet == true) {
      Matcher::SaveInnerGroups(matcher,minGroupId,maxGroupId,true,input,contStack);
    }
    else {
      Matcher::ResetInnerGroups(matcher,minGroupId,maxGroupId);
    }
    puVar6 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 0x1c);
    *instPointer = puVar6;
  }
  else {
    if ((uVar1 < uVar4) && (*inputOffset == origLoopInfo->startInputOffset)) {
      bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
      return bVar3;
    }
    uVar1 = (pBVar5->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.upper;
    if ((uVar1 == 0xffffffff) || (uVar4 < uVar1)) {
      if ((pBVar5->super_GreedyMixin).isGreedy == true) {
        pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                 Push<UnifiedRegex::ResumeCont>
                           (&contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        CVar2 = *inputOffset;
        LVar8 = (pBVar5->super_BeginLoopMixin).exitLabel;
        pcVar7[8] = '\0';
        *(undefined ***)pcVar7 = &PTR_Print_013e01e8;
        *(CharCount *)(pcVar7 + 0xc) = CVar2;
        *(Label *)(pcVar7 + 0x10) = LVar8;
        Matcher::PushStats(matcher,contStack,input);
        origLoopInfo->startInputOffset = *inputOffset;
        Matcher::SaveInnerGroups
                  (matcher,(pBVar5->super_BodyGroupsMixin).minBodyGroupId,
                   (pBVar5->super_BodyGroupsMixin).maxBodyGroupId,true,input,contStack);
        LVar8 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
      }
      else {
        pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                 Push<UnifiedRegex::RepeatLoopCont>
                           (&contStack->
                             super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
        LVar8 = (this->super_RepeatLoopMixin).beginLabel;
        CVar2 = *inputOffset;
        pcVar7[8] = '\x05';
        *(undefined ***)pcVar7 = &PTR_Print_013e02a8;
        *(Label *)(pcVar7 + 0xc) = LVar8;
        *(CharCount *)(pcVar7 + 0x10) = CVar2;
        Matcher::PushStats(matcher,contStack,input);
        LVar8 = (pBVar5->super_BeginLoopMixin).exitLabel;
      }
      puVar6 = Matcher::LabelToInstPointer(matcher,LVar8);
      *instPointer = puVar6;
    }
    else {
      puVar6 = Matcher::LabelToInstPointer(matcher,(pBVar5->super_BeginLoopMixin).exitLabel);
      *instPointer = puVar6;
    }
  }
  return false;
}

Assistant:

inline bool RepeatLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopInst* begin = matcher.L2I(BeginLoop, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // See comment (****) above.
        if (begin->hasInnerNondet)
        {
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body.
            loopInfo->startInputOffset = inputOffset;
            if(begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else if (inputOffset == loopInfo->startInputOffset && loopInfo->number > begin->repeats.lower)
        {
            // The minimum number of iterations has been satisfied but the last iteration made no progress.
            //   - With greedy & deterministic body, FAIL so as to undo that iteration and restore group bindings.
            //   - With greedy & non-deterministic body, FAIL so as to try another body alternative
            //   - With non-greedy, we're trying an additional iteration because the follow failed. But
            //     since we didn't consume anything the follow will fail again, so fail
            //
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Success: proceed to remainder.
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else if (begin->isGreedy)
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack continue from here with no more iterations
            PUSH(contStack, ResumeCont, inputOffset, begin->exitLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            loopInfo->startInputOffset = inputOffset;

            // If backtrack, we must continue with previous group bindings
            matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else
        {
            // CHOICEPOINT: Try no more iterations of body, if backtrack do one more iteration of body from here
            PUSH(contStack, RepeatLoopCont, beginLabel, inputOffset);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        return false;
    }